

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

bool __thiscall
google::protobuf::(anonymous_namespace)::SymbolByParentEq::operator()
          (void *this,Symbol *a,ParentNameQuery *b)

{
  int iVar1;
  bool bVar2;
  pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_> local_28;
  
  Symbol::parent_name_key(&local_28,(Symbol *)this);
  if (((SymbolBase *)local_28.first == a->ptr_) &&
     ((SymbolBase *)local_28.second._M_len == a[1].ptr_)) {
    if ((SymbolBase *)local_28.second._M_len == (SymbolBase *)0x0) {
      bVar2 = true;
    }
    else {
      iVar1 = bcmp(local_28.second._M_str,a[2].ptr_,local_28.second._M_len);
      bVar2 = iVar1 == 0;
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool operator()(const T& a, const U& b) const {
    return a.parent_name_key() == b.parent_name_key();
  }